

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

bool __thiscall Clasp::Asp::LogicProgram::propagate(LogicProgram *this,bool backprop)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  Atom_t AVar4;
  PrgAtom *this_00;
  byte in_SIL;
  LogicProgram *in_RDI;
  PrgAtom *a;
  size_type i;
  bool oldB;
  bool in_stack_0000008f;
  LogicProgram *in_stack_00000090;
  PrgAtom *in_stack_00000098;
  SharedContext *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint32 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  size_type sVar5;
  size_type local_18;
  
  uVar1 = *(uint *)&(in_RDI->opts_).field_0x4;
  *(uint *)&(in_RDI->opts_).field_0x4 =
       *(uint *)&(in_RDI->opts_).field_0x4 & 0xdfffffff | (uint)(in_SIL & 1) << 0x1d;
  local_18 = 0;
  do {
    sVar5 = local_18;
    sVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->propQ_);
    if (sVar5 == sVar3) {
      *(uint *)&(in_RDI->opts_).field_0x4 =
           *(uint *)&(in_RDI->opts_).field_0x4 & 0xdfffffff |
           (uint)((uVar1 >> 0x1d & 1) != 0) << 0x1d;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&in_RDI->propQ_);
      return true;
    }
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&in_RDI->propQ_,local_18);
    this_00 = getAtom((LogicProgram *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (Id_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    bVar2 = PrgNode::relevant((PrgNode *)this_00);
    if (bVar2) {
      bVar2 = PrgAtom::propagateValue(in_stack_00000098,in_stack_00000090,in_stack_0000008f);
      if (!bVar2) {
        setConflict((LogicProgram *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        return false;
      }
      bVar2 = PrgNode::hasVar((PrgNode *)this_00);
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 & 0xffffff;
      if (bVar2) {
        in_stack_ffffffffffffffc4 = PrgNode::id((PrgNode *)this_00);
        AVar4 = startAtom(in_RDI);
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 & 0xffffff;
        if (in_stack_ffffffffffffffc4 < AVar4) {
          in_stack_ffffffffffffffb8 = ProgramBuilder::ctx(&in_RDI->super_ProgramBuilder);
          PrgNode::trueLit((PrgNode *)CONCAT44(sVar5,in_stack_ffffffffffffffc8));
          bVar2 = SharedContext::addUnary
                            ((SharedContext *)CONCAT44(sVar5,in_stack_ffffffffffffffc8),
                             (Literal)(uint32)((ulong)in_RDI >> 0x20));
          in_stack_ffffffffffffffc8 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffc8) ^ 0xff000000;
        }
      }
      if ((in_stack_ffffffffffffffc8 & 0x1000000) != 0) {
        setConflict((LogicProgram *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        return false;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool LogicProgram::propagate(bool backprop) {
	assert(frozen());
	bool oldB = opts_.backprop != 0;
	opts_.backprop = backprop;
	for (VarVec::size_type i = 0; i != propQ_.size(); ++i) {
		PrgAtom* a = getAtom(propQ_[i]);
		if (!a->relevant()) { continue; }
		if (!a->propagateValue(*this, backprop)) {
			setConflict();
			return false;
		}
		if (a->hasVar() && a->id() < startAtom() && !ctx()->addUnary(a->trueLit())) {
			setConflict();
			return false;
		}
	}
	opts_.backprop = oldB;
	propQ_.clear();
	return true;
}